

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
upb::generator::anon_unknown_2::GenerateFile
          (anon_unknown_2 *this,DefPoolPair *pools,FileDefPtr file,Options *options,
          GeneratorContext *context)

{
  undefined8 uVar1;
  int iVar2;
  char *__str;
  ZeroCopyOutputStream *pZVar3;
  pointer pZVar4;
  LogMessage *pLVar5;
  FileDefPtr file_00;
  FileDefPtr file_01;
  undefined1 bootstrap;
  undefined7 uVar6;
  string_view proto_filename;
  LogMessage local_1d8;
  Voidify local_1c1;
  string_view local_1c0;
  Cord local_1b0;
  DefPoolPair *local_1a0;
  string local_198;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_178;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  stream_2;
  LogMessage local_168;
  Voidify local_151;
  string_view local_150;
  Cord local_140;
  DefPoolPair *local_130;
  string local_128;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_108;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  stream_1;
  undefined1 local_f8 [8];
  Output c_output;
  LogMessage local_d0;
  Voidify local_b9;
  string_view local_b8;
  Cord local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  string local_88;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_68;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  stream;
  undefined1 local_48 [8];
  Output h_output;
  GeneratorContext *context_local;
  Options *options_local;
  DefPoolPair *pools_local;
  FileDefPtr file_local;
  
  bootstrap = SUB81(context,0);
  uVar6 = (undefined7)((ulong)context >> 8);
  h_output.output_.field_2._8_8_ = options;
  pools_local = pools;
  Output::Output((Output *)local_48);
  WriteHeader(this,pools_local,file,(Options *)local_48,(Output *)CONCAT71(uVar6,bootstrap));
  uVar1 = h_output.output_.field_2._8_8_;
  __str = FileDefPtr::name((FileDefPtr *)&pools_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,__str);
  proto_filename._M_str = (char *)0x0;
  proto_filename._M_len = (size_t)local_98._M_str;
  CApiHeaderFilename_abi_cxx11_
            (&local_88,(generator *)local_98._M_len,proto_filename,(bool)bootstrap);
  pZVar3 = (ZeroCopyOutputStream *)(**(code **)(*(long *)uVar1 + 0x10))(uVar1,&local_88);
  absl::lts_20250127::WrapUnique<google::protobuf::io::ZeroCopyOutputStream>
            ((lts_20250127 *)&local_68,pZVar3);
  std::__cxx11::string::~string((string *)&local_88);
  pZVar4 = std::
           unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
           ::operator->(&local_68);
  c_output.output_.field_2._M_local_buf[0xf] = '\0';
  local_b8 = Output::output((Output *)local_48);
  absl::lts_20250127::Cord::Cord(&local_a8,local_b8);
  iVar2 = (*pZVar4->_vptr_ZeroCopyOutputStream[7])(pZVar4,&local_a8);
  if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/c/generator.cc"
               ,0x476,"stream->WriteCord(absl::Cord(h_output.output()))");
    c_output.output_.field_2._M_local_buf[0xf] = '\x01';
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_b9,pLVar5);
  }
  if ((c_output.output_.field_2._M_local_buf[0xf] & 1U) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d0);
  }
  absl::lts_20250127::Cord::~Cord(&local_a8);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr(&local_68);
  uVar1 = h_output.output_.field_2._8_8_;
  if (*(int *)&(file.ptr_)->opts == 0) {
    Output::Output((Output *)local_f8);
    stream_1._M_t.
    super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
         (__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
          )(__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
            )pools_local;
    WriteMiniDescriptorSource
              (this,pools_local,file,(Options *)local_f8,(Output *)CONCAT71(uVar6,bootstrap));
    uVar1 = h_output.output_.field_2._8_8_;
    local_130 = pools_local;
    (anonymous_namespace)::SourceFilename_abi_cxx11_
              (&local_128,(_anonymous_namespace_ *)pools_local,file_01);
    pZVar3 = (ZeroCopyOutputStream *)(**(code **)(*(long *)uVar1 + 0x10))(uVar1,&local_128);
    absl::lts_20250127::WrapUnique<google::protobuf::io::ZeroCopyOutputStream>
              ((lts_20250127 *)&local_108,pZVar3);
    std::__cxx11::string::~string((string *)&local_128);
    pZVar4 = std::
             unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             ::operator->(&local_108);
    stream_2._M_t.
    super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl._7_1_ =
         0;
    local_150 = Output::output((Output *)local_f8);
    absl::lts_20250127::Cord::Cord(&local_140,local_150);
    iVar2 = (*pZVar4->_vptr_ZeroCopyOutputStream[7])(pZVar4,&local_140);
    if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_168,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/c/generator.cc"
                 ,0x47d,"stream->WriteCord(absl::Cord(c_output.output()))");
      stream_2._M_t.
      super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl._7_1_
           = 1;
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_168);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_151,pLVar5);
    }
    if ((stream_2._M_t.
         super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
         .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl.
         _7_1_ & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_168);
    }
    absl::lts_20250127::Cord::~Cord(&local_140);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr(&local_108);
    Output::~Output((Output *)local_f8);
  }
  else {
    local_1a0 = pools_local;
    (anonymous_namespace)::SourceFilename_abi_cxx11_
              (&local_198,(_anonymous_namespace_ *)pools_local,file_00);
    pZVar3 = (ZeroCopyOutputStream *)(**(code **)(*(long *)uVar1 + 0x10))(uVar1,&local_198);
    absl::lts_20250127::WrapUnique<google::protobuf::io::ZeroCopyOutputStream>
              ((lts_20250127 *)&local_178,pZVar3);
    std::__cxx11::string::~string((string *)&local_198);
    pZVar4 = std::
             unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             ::operator->(&local_178);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,"\n");
    absl::lts_20250127::Cord::Cord(&local_1b0,local_1c0);
    iVar2 = (*pZVar4->_vptr_ZeroCopyOutputStream[7])(pZVar4,&local_1b0);
    if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/c/generator.cc"
                 ,0x483,"stream->WriteCord(absl::Cord(\"\\n\"))");
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1d8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1c1,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1d8);
    }
    absl::lts_20250127::Cord::~Cord(&local_1b0);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr(&local_178);
  }
  Output::~Output((Output *)local_48);
  return;
}

Assistant:

void GenerateFile(const DefPoolPair& pools, upb::FileDefPtr file,
                  const Options& options,
                  google::protobuf::compiler::GeneratorContext* context) {
  Output h_output;
  WriteHeader(pools, file, options, h_output);
  {
    auto stream =
        absl::WrapUnique(context->Open(CApiHeaderFilename(file.name(), false)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(h_output.output())));
  }

  if (options.bootstrap_stage == 0) {
    Output c_output;
    WriteMiniDescriptorSource(pools, file, options, c_output);
    auto stream = absl::WrapUnique(context->Open(SourceFilename(file)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(c_output.output())));
  } else {
    // TODO: remove once we can figure out how to make both Blaze
    // and Bazel happy with header-only libraries.

    auto stream = absl::WrapUnique(context->Open(SourceFilename(file)));
    ABSL_CHECK(stream->WriteCord(absl::Cord("\n")));
  }
}